

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

string * __thiscall
glcts::ViewportArray::DrawTestBase::getVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,DrawTestBase *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\nvoid main()\n{\n    /* empty */;\n}\n\n",&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string DrawTestBase::getVertexShader()
{
	static const GLchar* source = "${VERSION}\n"
								  "\n"
								  "void main()\n"
								  "{\n"
								  "    /* empty */;\n"
								  "}\n"
								  "\n";

	std::string result = source;

	return result;
}